

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.c
# Opt level: O1

int showmatch(int f,int n)

{
  char *pcVar1;
  byte bVar2;
  line *plVar3;
  line *plVar4;
  bool bVar5;
  mgwin *pmVar6;
  int iVar7;
  uint uVar8;
  line *plVar9;
  long lVar10;
  balance *pbVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  line *plVar19;
  byte local_138 [256];
  int local_38;
  int local_34;
  
  if (n < 1) {
    return 1;
  }
  iVar17 = 0;
  local_38 = n;
LAB_0011425c:
  iVar7 = selfinsert(8,1);
  pmVar6 = curwp;
  if (iVar7 != 1) {
    return iVar7;
  }
  uVar8 = (uint)key.k_chars[(long)key.k_count + -1];
  pbVar11 = bal;
  if (uVar8 != 0x29) {
    lVar10 = 0;
    do {
      lVar18 = lVar10;
      uVar15 = uVar8;
      if (lVar18 == 6) goto LAB_001142ab;
      lVar10 = lVar18 + 2;
    } while (key.k_chars[(long)key.k_count + -1] != (short)(&bal[1].right)[lVar18]);
    pbVar11 = (balance *)(&bal[1].left + lVar18);
  }
  uVar15 = (int)pbVar11->left;
LAB_001142ab:
  plVar19 = curwp->w_dotp;
  uVar13 = (ulong)(curwp->w_doto - 1);
  iVar7 = 0;
  do {
    iVar12 = (int)uVar13;
    if (iVar12 == 0) {
      plVar19 = plVar19->l_bp;
      if (plVar19 == curbp->b_headp) {
        dobeep();
        goto LAB_001144e4;
      }
      iVar12 = plVar19->l_used + 1;
    }
    uVar13 = (long)iVar12 - 1;
    if ((int)uVar13 == plVar19->l_used) {
      uVar16 = (uint)*curbp->b_nlchr;
    }
    else {
      uVar16 = (uint)(byte)plVar19->l_text[uVar13];
    }
    if (uVar16 == uVar15) {
      if (iVar7 == 0) break;
      iVar7 = iVar7 + -1;
    }
    iVar7 = iVar7 + (uint)(uVar16 == uVar8);
  } while( true );
  plVar9 = curwp->w_linep;
  plVar3 = curwp->w_dotp;
  plVar4 = plVar3->l_fp;
  local_34 = iVar17;
  if (plVar9 != plVar4) {
    bVar5 = false;
    do {
      if (plVar9 == plVar19) {
        bVar5 = true;
      }
      plVar9 = plVar9->l_fp;
    } while (plVar9 != plVar4);
    if (bVar5) {
      iVar17 = curwp->w_doto;
      curwp->w_dotp = plVar19;
      pmVar6->w_doto = (int)uVar13;
      pcVar1 = &pmVar6->w_rflag;
      *pcVar1 = *pcVar1 | 2;
      update(2);
      ttwait(1000);
      pmVar6 = curwp;
      curwp->w_dotp = plVar3;
      pmVar6->w_doto = iVar17;
      pcVar1 = &pmVar6->w_rflag;
      *pcVar1 = *pcVar1 | 2;
      update(2);
      iVar17 = local_34;
      goto LAB_001144e4;
    }
  }
  if (0 < plVar19->l_used) {
    lVar10 = 0;
    lVar18 = 1;
    uVar8 = 0;
    do {
      bVar2 = plVar19->l_text[lVar18 + -1];
      if ((ulong)bVar2 == 9) {
        iVar17 = ntabstop(uVar8,curbp->b_tabw);
        if (uVar8 < 0xff && (int)uVar8 < iVar17) {
          uVar13 = (ulong)uVar8;
          uVar15 = 0xfe - uVar8;
          if (~uVar8 + iVar17 < 0xfe - uVar8) {
            uVar15 = ~uVar8 + iVar17;
          }
          memset(local_138 + uVar13,0x20,(ulong)uVar15 + 1);
          lVar10 = (long)iVar17;
          if ((long)iVar17 < (long)(uVar13 + 1)) {
            lVar10 = uVar13 + 1;
          }
          uVar14 = ~uVar13 + lVar10;
          if (0xfe - uVar13 <= ~uVar13 + lVar10) {
            uVar14 = 0xfe - uVar13;
          }
          uVar8 = uVar8 + (int)uVar14 + 1;
        }
      }
      else if ((cinfo[bVar2] & 8U) == 0) {
        uVar8 = uVar8 + 1;
        local_138[lVar10] = bVar2;
      }
      else {
        if (0xfc < uVar8) goto LAB_001144b8;
        uVar13 = (ulong)uVar8;
        local_138[lVar10] = 0x5e;
        uVar8 = uVar8 + 2;
        local_138[uVar13 + 1] = bVar2 ^ 0x40;
      }
      lVar10 = (long)(int)uVar8;
      if ((plVar19->l_used <= lVar18) || (lVar18 = lVar18 + 1, 0xfe < uVar8)) goto LAB_001144b8;
    } while( true );
  }
  lVar10 = 0;
LAB_001144b8:
  local_138[lVar10] = 0;
  ewprintf("Matches %s",local_138);
  n = local_38;
  iVar17 = local_34;
LAB_001144e4:
  iVar17 = iVar17 + 1;
  if (iVar17 == n) {
    return 1;
  }
  goto LAB_0011425c;
}

Assistant:

int
showmatch(int f, int n)
{
	int	i, s;

	for (i = 0; i < n; i++) {
		if ((s = selfinsert(FFRAND, 1)) != TRUE)
			return (s);
		/* unbalanced -- warn user */
		if (balance() != TRUE)
			dobeep();
	}
	return (TRUE);
}